

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaoSolver.cpp
# Opt level: O3

bool __thiscall BaoSolver::checkIfConnect(BaoSolver *this,int v,uint32_t s)

{
  int *__s;
  uint uVar1;
  int (*paiVar2) [40];
  uint uVar3;
  uint *puVar4;
  long lVar5;
  ulong uVar6;
  uint *puVar7;
  bool bVar8;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  uint local_90;
  int local_8c;
  _Deque_base<int,_std::allocator<int>_> local_88;
  int (*local_38) [40];
  
  __s = this->dis;
  local_8c = v;
  memset(__s,0,0xa0);
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_88,0);
  puVar4 = (uint *)local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
  puVar7 = (uint *)local_88._M_impl.super__Deque_impl_data._M_start._M_last;
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      if ((uint *)local_88._M_impl.super__Deque_impl_data._M_start._M_cur == puVar7 + -1) {
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first);
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
        puVar7 = (uint *)local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80;
        puVar4 = (uint *)local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
        local_88._M_impl.super__Deque_impl_data._M_start._M_first =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)puVar7;
        local_88._M_impl.super__Deque_impl_data._M_start._M_node =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
    } while (puVar4 != (uint *)local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  if (puVar4 == (uint *)(local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1)) {
    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
              ((deque<int,std::allocator<int>> *)&local_88,&local_8c);
  }
  else {
    *puVar4 = v;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)(puVar4 + 1);
  }
  __s[local_8c] = 1;
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    uVar3 = this->n;
  }
  else {
    local_38 = this->edge;
    do {
      uVar1 = *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first);
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_88._M_impl.super__Deque_impl_data._M_start._M_last =
             (_Elt_pointer)((uint *)local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80);
        local_88._M_impl.super__Deque_impl_data._M_start._M_first =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_88._M_impl.super__Deque_impl_data._M_start._M_node =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      paiVar2 = local_38;
      local_90 = 0;
      uVar3 = this->n;
      if (0 < (int)uVar3) {
        do {
          lVar5 = (long)(int)local_90;
          if (((paiVar2[(int)uVar1][lVar5] != 0) && ((s >> (local_90 & 0x1f) & 1) != 0)) &&
             (__s[lVar5] != 1)) {
            __s[lVar5] = 1;
            if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                        ((deque<int,std::allocator<int>> *)&local_88,(int *)&local_90);
            }
            else {
              *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_90;
              local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
            }
          }
          local_90 = local_90 + 1;
          uVar3 = this->n;
        } while ((int)local_90 < (int)uVar3);
      }
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  if ((int)uVar3 < 1) {
    bVar8 = true;
  }
  else {
    bVar8 = true;
    uVar6 = 0;
    do {
      if ((s >> ((uint)uVar6 & 0x1f) & 1) != 0) {
        bVar8 = (bool)(bVar8 & (byte)__s[uVar6]);
      }
      uVar6 = uVar6 + 1;
    } while (uVar3 != uVar6);
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_88);
  return bVar8;
}

Assistant:

bool BaoSolver::checkIfConnect(int v, uint32_t s) {
    memset(dis, 0, sizeof(dis));
    queue <int> q;
    while(!q.empty()) q.pop();
    q.push(v); dis[v] = 1;
    while(!q.empty()) {
        int tt = q.front(); q.pop();
        for (int i = 0; i < n; i++) if (edge[tt][i] && ((s >> i) & 1)) {
            if (dis[i] != 1) {
                dis[i] = 1;
                q.push(i);
            }
        }
    }
    bool flag = true;
    for (int i = 0; i < n; i++) if ((s >> i) & 1) {
        flag &= dis[i];
    }
    return flag;
}